

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_handler.cpp
# Opt level: O2

void __thiscall
ProtoHandler::OnRemoveBreakPointReq(ProtoHandler *this,RemoveBreakpointParams *params)

{
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EmmyDebuggerManager *this_00;
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<BreakPoint> bp;
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = EmmyFacade::GetDebugManager(this->_owner);
  p_Var1 = &((params->breakPoints).
             super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((params->breakPoints).
                  super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>; p_Var2 != p_Var1;
      p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_38,p_Var2);
    EmmyDebuggerManager::RemoveBreakpoint(this_00,&(local_38._M_ptr)->file,(local_38._M_ptr)->line);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  return;
}

Assistant:

void ProtoHandler::OnRemoveBreakPointReq(RemoveBreakpointParams &params) {
	auto &manager = _owner->GetDebugManager();
	for (auto bp: params.breakPoints) {
		manager.RemoveBreakpoint(bp->file, bp->line);
	}
}